

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::boolean_&,_const_type_safe::boolean_&> * __thiscall
Catch::ExprLhs<type_safe::boolean_const&>::operator!=
          (BinaryExpr<const_type_safe::boolean_&,_const_type_safe::boolean_&>
           *__return_storage_ptr__,ExprLhs<type_safe::boolean_const&> *this,boolean *rhs)

{
  bool bVar1;
  bool bVar2;
  boolean *pbVar3;
  StringRef local_40;
  
  pbVar3 = *(boolean **)this;
  bVar1 = pbVar3->value_;
  bVar2 = rhs->value_;
  StringRef::StringRef(&local_40,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar1 != bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021d5e8;
  __return_storage_ptr__->m_lhs = pbVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }